

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

void pax_time(char *p,int64_t *ps,long *pn)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  byte bVar7;
  
  lVar6 = 0;
  pcVar5 = p + (*p == '-');
  do {
    pcVar4 = pcVar5 + 1;
    bVar7 = *pcVar5 - 0x30;
    if (9 < bVar7) {
LAB_0035736d:
      lVar2 = -lVar6;
      if (*p != '-') {
        lVar2 = lVar6;
      }
      *ps = lVar2;
      *pn = 0;
      if (*pcVar5 == '.') {
        lVar6 = 0;
        uVar3 = 100000000;
        do {
          if (9 < (byte)(*pcVar4 - 0x30U)) {
            return;
          }
          lVar6 = lVar6 + (byte)(*pcVar4 - 0x30U) * uVar3;
          *pn = lVar6;
          pcVar4 = pcVar4 + 1;
          bVar1 = 9 < uVar3;
          uVar3 = uVar3 / 10;
        } while (bVar1);
      }
      return;
    }
    if ((0xccccccccccccccc < lVar6) || (lVar6 == 0xccccccccccccccc && 7 < bVar7)) {
      lVar6 = 0x7fffffffffffffff;
      goto LAB_0035736d;
    }
    lVar6 = (ulong)bVar7 + lVar6 * 10;
    pcVar5 = pcVar4;
  } while( true );
}

Assistant:

static void
pax_time(const char *p, int64_t *ps, long *pn)
{
	char digit;
	int64_t	s;
	unsigned long l;
	int sign;
	int64_t limit, last_digit_limit;

	limit = INT64_MAX / 10;
	last_digit_limit = INT64_MAX % 10;

	s = 0;
	sign = 1;
	if (*p == '-') {
		sign = -1;
		p++;
	}
	while (*p >= '0' && *p <= '9') {
		digit = *p - '0';
		if (s > limit ||
		    (s == limit && digit > last_digit_limit)) {
			s = INT64_MAX;
			break;
		}
		s = (s * 10) + digit;
		++p;
	}

	*ps = s * sign;

	/* Calculate nanoseconds. */
	*pn = 0;

	if (*p != '.')
		return;

	l = 100000000UL;
	do {
		++p;
		if (*p >= '0' && *p <= '9')
			*pn += (*p - '0') * l;
		else
			break;
	} while (l /= 10);
}